

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inspect(uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint *type;
  char *in_RCX;
  long in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  ulong in_R8;
  uint checksum;
  uint CRC;
  LodePNGInfo *info;
  uint height;
  uint width;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_4;
  
  type = (uint *)(in_RDX + 0xd0);
  if ((in_R8 == 0) || (in_RCX == (char *)0x0)) {
    *(undefined4 *)(in_RDX + 0x278) = 0x30;
    local_4 = 0x30;
  }
  else if (in_R8 < 0x21) {
    *(undefined4 *)(in_RDX + 0x278) = 0x1b;
    local_4 = 0x1b;
  }
  else {
    lodepng_info_cleanup((LodePNGInfo *)0x34c1f7);
    lodepng_info_init((LodePNGInfo *)0x34c201);
    if (((((*in_RCX == -0x77) && (in_RCX[1] == 'P')) && (in_RCX[2] == 'N')) &&
        ((in_RCX[3] == 'G' && (in_RCX[4] == '\r')))) &&
       ((in_RCX[5] == '\n' && ((in_RCX[6] == '\x1a' && (in_RCX[7] == '\n')))))) {
      uVar2 = lodepng_chunk_length((uchar *)0x34c29c);
      if (uVar2 == 0xd) {
        uVar1 = lodepng_chunk_type_equals
                          ((uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (char *)type);
        if (uVar1 == '\0') {
          *(undefined4 *)(in_RDX + 0x278) = 0x1d;
          local_4 = 0x1d;
        }
        else {
          uVar2 = lodepng_read32bitInt((uchar *)(in_RCX + 0x10));
          uVar3 = lodepng_read32bitInt((uchar *)(in_RCX + 0x14));
          if (in_RDI != (uint *)0x0) {
            *in_RDI = uVar2;
          }
          if (in_RSI != (uint *)0x0) {
            *in_RSI = uVar3;
          }
          type[5] = (uint)(byte)in_RCX[0x18];
          type[4] = (uint)(byte)in_RCX[0x19];
          *type = (uint)(byte)in_RCX[0x1a];
          type[1] = (uint)(byte)in_RCX[0x1b];
          type[2] = (uint)(byte)in_RCX[0x1c];
          if ((uVar2 == 0) || (uVar3 == 0)) {
            *(undefined4 *)(in_RDX + 0x278) = 0x5d;
            local_4 = 0x5d;
          }
          else {
            uVar2 = checkColorValidity(type[4],type[5]);
            *(uint *)(in_RDX + 0x278) = uVar2;
            if (*(int *)(in_RDX + 0x278) == 0) {
              if (*type == 0) {
                if (type[1] == 0) {
                  if (type[2] < 2) {
                    if (*(int *)(in_RDX + 0x28) == 0) {
                      uVar2 = lodepng_read32bitInt((uchar *)(in_RCX + 0x1d));
                      uVar3 = lodepng_crc32((uchar *)(in_RCX + 0xc),0x11);
                      if (uVar2 != uVar3) {
                        *(undefined4 *)(in_RDX + 0x278) = 0x39;
                        return 0x39;
                      }
                    }
                    local_4 = *(uint *)(in_RDX + 0x278);
                  }
                  else {
                    *(undefined4 *)(in_RDX + 0x278) = 0x22;
                    local_4 = 0x22;
                  }
                }
                else {
                  *(undefined4 *)(in_RDX + 0x278) = 0x21;
                  local_4 = 0x21;
                }
              }
              else {
                *(undefined4 *)(in_RDX + 0x278) = 0x20;
                local_4 = 0x20;
              }
            }
            else {
              local_4 = *(uint *)(in_RDX + 0x278);
            }
          }
        }
      }
      else {
        *(undefined4 *)(in_RDX + 0x278) = 0x5e;
        local_4 = 0x5e;
      }
    }
    else {
      *(undefined4 *)(in_RDX + 0x278) = 0x1c;
      local_4 = 0x1c;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_inspect(unsigned* w, unsigned* h, LodePNGState* state,
                         const unsigned char* in, size_t insize) {
  unsigned width, height;
  LodePNGInfo* info = &state->info_png;
  if(insize == 0 || in == 0) {
    CERROR_RETURN_ERROR(state->error, 48); /*error: the given data is empty*/
  }
  if(insize < 33) {
    CERROR_RETURN_ERROR(state->error, 27); /*error: the data length is smaller than the length of a PNG header*/
  }

  /*when decoding a new PNG image, make sure all parameters created after previous decoding are reset*/
  /* TODO: remove this. One should use a new LodePNGState for new sessions */
  lodepng_info_cleanup(info);
  lodepng_info_init(info);

  if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
     || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10) {
    CERROR_RETURN_ERROR(state->error, 28); /*error: the first 8 bytes are not the correct PNG signature*/
  }
  if(lodepng_chunk_length(in + 8) != 13) {
    CERROR_RETURN_ERROR(state->error, 94); /*error: header size must be 13 bytes*/
  }
  if(!lodepng_chunk_type_equals(in + 8, "IHDR")) {
    CERROR_RETURN_ERROR(state->error, 29); /*error: it doesn't start with a IHDR chunk!*/
  }

  /*read the values given in the header*/
  width = lodepng_read32bitInt(&in[16]);
  height = lodepng_read32bitInt(&in[20]);
  /*TODO: remove the undocumented feature that allows to give null pointers to width or height*/
  if(w) *w = width;
  if(h) *h = height;
  info->color.bitdepth = in[24];
  info->color.colortype = (LodePNGColorType)in[25];
  info->compression_method = in[26];
  info->filter_method = in[27];
  info->interlace_method = in[28];

  /*errors returned only after the parsing so other values are still output*/

  /*error: invalid image size*/
  if(width == 0 || height == 0) CERROR_RETURN_ERROR(state->error, 93);
  /*error: invalid colortype or bitdepth combination*/
  state->error = checkColorValidity(info->color.colortype, info->color.bitdepth);
  if(state->error) return state->error;
  /*error: only compression method 0 is allowed in the specification*/
  if(info->compression_method != 0) CERROR_RETURN_ERROR(state->error, 32);
  /*error: only filter method 0 is allowed in the specification*/
  if(info->filter_method != 0) CERROR_RETURN_ERROR(state->error, 33);
  /*error: only interlace methods 0 and 1 exist in the specification*/
  if(info->interlace_method > 1) CERROR_RETURN_ERROR(state->error, 34);

  if(!state->decoder.ignore_crc) {
    unsigned CRC = lodepng_read32bitInt(&in[29]);
    unsigned checksum = lodepng_crc32(&in[12], 17);
    if(CRC != checksum) {
      CERROR_RETURN_ERROR(state->error, 57); /*invalid CRC*/
    }
  }

  return state->error;
}